

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool IsBlockMutated(CBlock *block,bool check_witness_root)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  long in_FS_OFFSET;
  Level in_stack_00000040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000050;
  BlockValidationState state;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffffea0;
  CTransaction *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb8;
  ValidationState<BlockValidationResult> *in_stack_fffffffffffffed8;
  BlockValidationState *in_stack_fffffffffffffee8;
  CBlock *in_stack_fffffffffffffef0;
  LogFlags in_stack_ffffffffffffff00;
  char *flag;
  int in_stack_ffffffffffffff0c;
  bool local_d1;
  BlockValidationState *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff47;
  ConstevalFormatString<1U> in_stack_ffffffffffffff48;
  string_view in_stack_ffffffffffffff50;
  string_view in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BlockValidationState::BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  bVar2 = CheckMerkleRoot(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (bVar2) {
    bVar2 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::empty((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)in_stack_fffffffffffffea8);
    if (!bVar2) {
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      bVar2 = CTransaction::IsCoinBase(in_stack_fffffffffffffea8);
      if (bVar2) {
        bVar2 = CheckWitnessMalleation
                          ((CBlock *)in_stack_ffffffffffffff48.fmt,(bool)in_stack_ffffffffffffff47,
                           in_stack_ffffffffffffff38);
        if (bVar2) {
          local_d1 = false;
        }
        else {
          bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                    Trace);
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
            ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                      ((ValidationState<BlockValidationResult> *)"Block mutated: %s\n");
            in_stack_fffffffffffffe98 = 1;
            LogPrintFormatInternal<std::__cxx11::string>
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff50,in_stack_ffffffffffffff0c
                       ,in_stack_ffffffffffffff00,in_stack_00000040,in_stack_ffffffffffffff48,
                       in_stack_00000050);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          }
          local_d1 = true;
        }
        goto LAB_0149df1c;
      }
    }
    cVar3 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::begin(in_stack_fffffffffffffea0);
    cVar4 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::end(in_stack_fffffffffffffea0);
    local_d1 = std::
               any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,IsBlockMutated(CBlock_const&,bool)::__0>
                         (cVar3._M_current,cVar4._M_current);
  }
  else {
    bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),Trace);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      flag = "Block mutated: %s\n";
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_(in_stack_fffffffffffffed8);
      in_stack_fffffffffffffe98 = 1;
      LogPrintFormatInternal<std::__cxx11::string>
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff50,in_stack_ffffffffffffff0c,
                 (LogFlags)flag,in_stack_00000040,in_stack_ffffffffffffff48,in_stack_00000050);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    local_d1 = true;
  }
LAB_0149df1c:
  BlockValidationState::~BlockValidationState
            ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_d1;
}

Assistant:

bool IsBlockMutated(const CBlock& block, bool check_witness_root)
{
    BlockValidationState state;
    if (!CheckMerkleRoot(block, state)) {
        LogDebug(BCLog::VALIDATION, "Block mutated: %s\n", state.ToString());
        return true;
    }

    if (block.vtx.empty() || !block.vtx[0]->IsCoinBase()) {
        // Consider the block mutated if any transaction is 64 bytes in size (see 3.1
        // in "Weaknesses in Bitcoin’s Merkle Root Construction":
        // https://lists.linuxfoundation.org/pipermail/bitcoin-dev/attachments/20190225/a27d8837/attachment-0001.pdf).
        //
        // Note: This is not a consensus change as this only applies to blocks that
        // don't have a coinbase transaction and would therefore already be invalid.
        return std::any_of(block.vtx.begin(), block.vtx.end(),
                           [](auto& tx) { return GetSerializeSize(TX_NO_WITNESS(tx)) == 64; });
    } else {
        // Theoretically it is still possible for a block with a 64 byte
        // coinbase transaction to be mutated but we neglect that possibility
        // here as it requires at least 224 bits of work.
    }

    if (!CheckWitnessMalleation(block, check_witness_root, state)) {
        LogDebug(BCLog::VALIDATION, "Block mutated: %s\n", state.ToString());
        return true;
    }

    return false;
}